

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_get.c
# Opt level: O1

void test_get_on_response(nhr_request request,nhr_response response)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  char *value;
  long lVar5;
  cJSON *pcVar6;
  cJSON *object;
  cJSON *pcVar7;
  cJSON *pcVar8;
  ulong uVar9;
  bool bVar10;
  
  value = (char *)nhr_response_get_body(response);
  uVar3 = nhr_response_get_body_length(response);
  lVar5 = nhr_request_get_user_object(request);
  test_get_error = 1;
  printf("\nResponse #%lu:\n");
  if (uVar3 != 0 && value != (char *)0x0) {
    uVar9 = 0;
    do {
      putchar((int)value[uVar9]);
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  if (lVar5 == 0) {
    test_get_working = '\0';
    test_get_error = 10;
    return;
  }
  if (lVar5 == 4) {
    uVar1 = nhr_response_get_status_code(response);
    printf("\nGet status code: %i, need 418",(ulong)uVar1);
    sVar2 = nhr_response_get_status_code(response);
    bVar10 = sVar2 == 0x1a2;
    test_get_error = 0xe;
  }
  else {
    sVar2 = nhr_response_get_status_code(response);
    if (sVar2 != 200) {
      test_get_working = '\0';
      test_get_error = 0xf;
      return;
    }
    if (lVar5 != 5) {
      if (uVar3 == 0 || value == (char *)0x0) {
        test_get_working = '\0';
        test_get_error = 5;
        return;
      }
      object = (cJSON *)0x0;
      pcVar6 = cJSON_ParseWithOpts(value,(char **)0x0,0);
      if (pcVar6 == (cJSON *)0x0) {
        bVar10 = false;
      }
      else {
        object = cJSON_GetObjectItem(pcVar6,"args");
        pcVar7 = cJSON_GetObjectItem(pcVar6,"headers");
        bVar10 = pcVar7 != (cJSON *)0x0;
      }
      if (object == (cJSON *)0x0) {
        pcVar7 = (cJSON *)0x0;
      }
      else {
        pcVar7 = cJSON_GetObjectItem(object,"test_get_param_name1");
      }
      if (pcVar6 == (cJSON *)0x0) {
        pcVar8 = (cJSON *)0x0;
        pcVar6 = (cJSON *)0x0;
      }
      else {
        pcVar8 = cJSON_GetObjectItem(pcVar6,"deflated");
        pcVar6 = cJSON_GetObjectItem(pcVar6,"gzipped");
      }
      if (lVar5 == 3) {
        if (pcVar6 == (cJSON *)0x0) {
          test_get_working = '\0';
          test_get_error = 0xc;
          return;
        }
        iVar4 = pcVar6->valueint;
      }
      else {
        if (lVar5 != 2) {
          if (lVar5 != 1) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          if (!(bool)(pcVar7 != (cJSON *)0x0 & object != (cJSON *)0x0 & bVar10)) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          if (pcVar7->valuestring == (char *)0x0) {
            test_get_working = '\0';
            test_get_error = 0xc;
            return;
          }
          iVar4 = strcmp("test_get_param_value1",pcVar7->valuestring);
          test_get_working = '\0';
          test_get_error = (uint)(iVar4 != 0) * 9;
          return;
        }
        if (pcVar8 == (cJSON *)0x0) {
          test_get_working = '\0';
          test_get_error = 0xc;
          return;
        }
        iVar4 = pcVar8->valueint;
      }
      if (iVar4 == 0) {
        test_get_working = '\0';
        test_get_error = 0xc;
        return;
      }
      test_get_working = '\0';
      test_get_error = 0;
      return;
    }
    printf("\nGet body_len: %u, need 1024",(ulong)uVar3);
    bVar10 = uVar3 == 0x400;
    test_get_error = 0xf;
  }
  if (bVar10) {
    test_get_error = 0;
  }
  test_get_working = '\0';
  return;
}

Assistant:

static void test_get_on_response(nhr_request request, nhr_response response) {
	char * body = nhr_response_get_body(response);
	unsigned int body_len = nhr_response_get_body_length(response);
	unsigned long test_number = (unsigned long)nhr_request_get_user_object(request);

	test_get_error = 1;
	printf("\nResponse #%lu:\n", test_number);
	test_get_log_body(body, body_len);
	if (test_number == 0) {
		test_get_error = 10;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 4) { // status code 418
		printf("\nGet status code: %i, need 418", (int)nhr_response_get_status_code(response));
		test_get_error = nhr_response_get_status_code(response) == 418 ? 0 : 14;
		test_get_working = nhr_false;
		return;
	}

	if (nhr_response_get_status_code(response) != 200) {
		test_get_error = 15;
		test_get_working = nhr_false;
		return;
	}

	if (test_number == 5) {
		printf("\nGet body_len: %u, need 1024", body_len);
		test_get_error = body_len == 1024 ? 0 : 15;
		test_get_working = nhr_false;
		return;
	}

	if (body && body_len) {
		test_get_error = test_get_parse_body(body, test_number);
	} else {
		test_get_error = 5;
	}

	test_get_working = nhr_false;
}